

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimfmtprops.h
# Opt level: O1

CurrencyPluralInfoWrapper * __thiscall
icu_63::number::impl::CurrencyPluralInfoWrapper::operator=
          (CurrencyPluralInfoWrapper *this,CurrencyPluralInfoWrapper *other)

{
  CurrencyPluralInfo *pCVar1;
  CurrencyPluralInfo *this_00;
  
  if ((other->fPtr).super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr !=
      (CurrencyPluralInfo *)0x0) {
    this_00 = (CurrencyPluralInfo *)UMemory::operator_new((UMemory *)0x28,(size_t)other);
    if (this_00 == (CurrencyPluralInfo *)0x0) {
      this_00 = (CurrencyPluralInfo *)0x0;
    }
    else {
      CurrencyPluralInfo::CurrencyPluralInfo
                (this_00,(other->fPtr).super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr);
    }
    pCVar1 = (this->fPtr).super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr;
    if (pCVar1 != (CurrencyPluralInfo *)0x0) {
      (*(pCVar1->super_UObject)._vptr_UObject[1])();
    }
    (this->fPtr).super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr = this_00;
  }
  return this;
}

Assistant:

CurrencyPluralInfoWrapper& operator=(const CurrencyPluralInfoWrapper& other) {
        if (!other.fPtr.isNull()) {
            fPtr.adoptInstead(new CurrencyPluralInfo(*other.fPtr));
        }
        return *this;
    }